

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O2

void init_robot(int i)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)i;
  robots[lVar1].status = 0;
  robots[lVar1].x = 0;
  robots[lVar1].y = 0;
  robots[lVar1].org_x = 0;
  robots[lVar1].org_y = 0;
  robots[lVar1].range = 0;
  robots[lVar1].last_x = -1;
  robots[lVar1].last_y = -1;
  robots[lVar1].speed = 0;
  robots[lVar1].last_speed = -1;
  robots[lVar1].accel = 0;
  robots[lVar1].d_speed = 0;
  robots[lVar1].heading = 0;
  robots[lVar1].last_heading = -1;
  robots[lVar1].d_heading = 0;
  robots[lVar1].damage = 0;
  robots[lVar1].last_damage = -1;
  robots[lVar1].scan = 0;
  robots[lVar1].last_scan = -1;
  robots[lVar1].reload = 0;
  for (lVar2 = 0x18; lVar2 != 0x70; lVar2 = lVar2 + 0x2c) {
    *(undefined4 *)
     (&std::__detail::_AnyMatcher<std::__cxx11::regex_traits<char>,false,true,false>::
       operator()(char)::__nul + lVar2 + lVar1 * 0x58) = 0;
    *(undefined8 *)(lVar1 * 0x58 + 0x157ffc + lVar2) = 0xffffffffffffffff;
  }
  return;
}

Assistant:

void init_robot(int i)
{
	 int j;

	robots[i].status = DEAD;
	robots[i].x = 0;
	robots[i].y = 0;
	robots[i].org_x = 0;
	robots[i].org_y = 0;
	robots[i].range = 0;
	robots[i].last_x = -1;
	robots[i].last_y = -1;
	robots[i].speed = 0;
	robots[i].last_speed = -1;
	robots[i].accel = 0;
	robots[i].d_speed = 0;
	robots[i].heading = 0;
	robots[i].last_heading = -1;
	robots[i].d_heading = 0;
	robots[i].damage = 0;
	robots[i].last_damage = -1;
	robots[i].scan = 0;
	robots[i].last_scan = -1;
	robots[i].reload = 0;
	for (j = 0; j < MIS_ROBOT; j++) {
		missiles[i][j].stat = AVAIL;
		missiles[i][j].last_xx = -1;
		missiles[i][j].last_yy = -1;
	}
}